

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeBBox *a_rect,ON_SimpleArray<int> *a_result)

{
  bool bVar1;
  int local_3c;
  ON_RTreeBranch *local_38;
  ON_RTreeBranch *branch;
  int count;
  int i;
  ON_SimpleArray<int> *a_result_local;
  ON_RTreeBBox *a_rect_local;
  ON_RTreeNode *a_node_local;
  
  branch._0_4_ = a_node->m_count;
  if (0 < (int)branch) {
    local_38 = a_node->m_branch;
    _count = a_result;
    a_result_local = (ON_SimpleArray<int> *)a_rect;
    a_rect_local = (ON_RTreeBBox *)a_node;
    bVar1 = ON_RTreeNode::IsInternalNode(a_node);
    if (bVar1) {
      for (branch._4_4_ = 0; branch._4_4_ < (int)branch; branch._4_4_ = branch._4_4_ + 1) {
        bVar1 = OverlapHelper((ON_RTreeBBox *)a_result_local,&local_38[branch._4_4_].m_rect);
        if ((bVar1) &&
           (bVar1 = SearchHelper(local_38[branch._4_4_].field_1.m_child,
                                 (ON_RTreeBBox *)a_result_local,_count), !bVar1)) {
          return false;
        }
      }
    }
    else {
      for (branch._4_4_ = 0; branch._4_4_ < (int)branch; branch._4_4_ = branch._4_4_ + 1) {
        bVar1 = OverlapHelper((ON_RTreeBBox *)a_result_local,&local_38[branch._4_4_].m_rect);
        if (bVar1) {
          local_3c = (int)local_38[branch._4_4_].field_1.m_id;
          ON_SimpleArray<int>::Append(_count,&local_3c);
        }
      }
    }
  }
  return true;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, const ON_RTreeBBox* a_rect, ON_SimpleArray<int> &a_result)
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if(!SearchHelper(branch[i].m_child, a_rect, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for(i=0; i < count; ++i)
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          a_result.Append( (int)branch[i].m_id );
        }
      }
    }
  }

  return true; // Continue searching
}